

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O0

void __thiscall
vkt::pipeline::CoordinateCaptureProgram::CoordinateCaptureProgram(CoordinateCaptureProgram *this)

{
  CoordinateCaptureProgram *this_local;
  
  Program::Program(&this->super_Program);
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__CoordinateCaptureProgram_01662be8;
  TexCoordVertexShader::TexCoordVertexShader(&this->m_vertexShader);
  CoordinateCaptureFragmentShader::CoordinateCaptureFragmentShader(&this->m_fragmentShader);
  return;
}

Assistant:

CoordinateCaptureProgram (void)
	{
	}